

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandClockGate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Io_FileType_t FileType;
  Abc_Ntk_t *pCare;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  Cgt_Par_t Pars;
  Cgt_Par_t local_64;
  Abc_Frame_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_40 = pAbc;
  local_38 = Abc_FrameReadNtk(pAbc);
  Cgt_SetDefaultParams(&local_64);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"LNDCVKavwh"), pAVar3 = local_38,
          iVar7 = globalUtilOptind, 0x55 < iVar1) {
      if (iVar1 < 0x76) {
        if (iVar1 == 0x56) {
          if (argc <= globalUtilOptind) {
            pcVar6 = "Command line switch \"-V\" should be followed by an integer.\n";
            goto LAB_00269bb0;
          }
          uVar2 = atoi(argv[globalUtilOptind]);
          local_64.nVarsMin = uVar2;
          goto LAB_00269af6;
        }
        piVar4 = &local_64.fAreaOnly;
        if (iVar1 != 0x61) goto switchD_00269a1d_caseD_45;
      }
      else {
        piVar4 = &local_64.fVerbose;
        if (iVar1 != 0x76) {
          if (iVar1 != 0x77) goto switchD_00269a1d_caseD_45;
          piVar4 = &local_64.fVeryVerbose;
        }
      }
      *(byte *)piVar4 = (byte)*piVar4 ^ 1;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00269bb0:
        Abc_Print(-1,pcVar6);
        goto switchD_00269a1d_caseD_45;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_64.nConfMax = uVar2;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-D\" should be followed by an integer.\n";
        goto LAB_00269bb0;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_64.nOdcMax = uVar2;
      break;
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4d:
      goto switchD_00269a1d_caseD_45;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-K\" should be followed by an integer.\n";
        goto LAB_00269bb0;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_64.nFlopsMin = uVar2;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_00269bb0;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_64.nLevelMax = uVar2;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_00269bb0;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_64.nCandMax = uVar2;
      break;
    default:
      if (iVar1 == -1) {
        if (local_38 != (Abc_Ntk_t *)0x0) {
          if (globalUtilOptind + 1 == argc) {
            pcVar6 = argv[globalUtilOptind];
            FileType = Io_ReadFileType(pcVar6);
            iVar7 = 1;
            pCare = Io_Read(pcVar6,FileType,1,0);
            if (pCare == (Abc_Ntk_t *)0x0) {
              pcVar6 = "Reading care network has failed.\n";
              goto LAB_00269d68;
            }
            pAVar3 = Abc_NtkDarClockGate(pAVar3,pCare,&local_64);
            Abc_NtkDelete(pCare);
LAB_00269d37:
            if (pAVar3 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(local_40,pAVar3);
              return 0;
            }
            pcVar6 = "Clock gating has failed.\n";
          }
          else {
            if (globalUtilOptind == argc) {
              pAVar3 = Abc_NtkDarClockGate(local_38,(Abc_Ntk_t *)0x0,&local_64);
              goto LAB_00269d37;
            }
            pcVar6 = "Wrong number of arguments.\n";
          }
          iVar7 = 0;
LAB_00269d68:
          Abc_Print(-1,pcVar6);
          return iVar7;
        }
        pcVar6 = "Empty network.\n";
        iVar7 = -1;
        goto LAB_00269cf6;
      }
      goto switchD_00269a1d_caseD_45;
    }
LAB_00269af6:
    globalUtilOptind = iVar7 + 1;
  } while (0 < (int)uVar2);
switchD_00269a1d_caseD_45:
  Abc_Print(-2,"usage: clockgate [-LNDCVK <num>] [-avwh] <file>\n");
  Abc_Print(-2,"\t         sequential clock gating with observability don\'t-cares\n");
  Abc_Print(-2,"\t-L num : max level number of a clock gate [default = %d]\n",
            (ulong)(uint)local_64.nLevelMax);
  Abc_Print(-2,"\t-N num : max number of candidates for a flop [default = %d]\n",
            (ulong)(uint)local_64.nCandMax);
  Abc_Print(-2,"\t-D num : max number of ODC levels to consider [default = %d]\n",
            (ulong)(uint)local_64.nOdcMax);
  Abc_Print(-2,"\t-C num : max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_64.nConfMax);
  Abc_Print(-2,"\t-V num : min number of vars to recycle SAT solver [default = %d]\n",
            (ulong)(uint)local_64.nVarsMin);
  Abc_Print(-2,"\t-K num : min number of flops to recycle SAT solver [default = %d]\n",
            (ulong)(uint)local_64.nFlopsMin);
  pcVar5 = "yes";
  pcVar6 = "yes";
  if (local_64.fAreaOnly == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle minimizing area-only [default = %s]\n",pcVar6);
  pcVar6 = "yes";
  if (local_64.fVerbose == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar6);
  if (local_64.fVeryVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-w     : toggle even more detailed output [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  pcVar6 = "\tfile   : (optional) constraints for primary inputs and register outputs\n";
  iVar7 = -2;
LAB_00269cf6:
  Abc_Print(iVar7,pcVar6);
  return 1;
}

Assistant:

int Abc_CommandClockGate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cgt_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk, * pNtkCare;
    int c;

    extern Abc_Ntk_t * Abc_NtkDarClockGate( Abc_Ntk_t * pNtk, Abc_Ntk_t * pCare, Cgt_Par_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Cgt_SetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LNDCVKavwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLevelMax <= 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCandMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCandMax <= 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOdcMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOdcMax <= 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfMax <= 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVarsMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVarsMin <= 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFlopsMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFlopsMin <= 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNtkCare = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
        if ( pNtkCare == NULL )
        {
            Abc_Print( -1, "Reading care network has failed.\n" );
            return 1;
        }
        // modify the current network
        pNtkRes = Abc_NtkDarClockGate( pNtk, pNtkCare, pPars );
        Abc_NtkDelete( pNtkCare );
    }
    else if ( argc == globalUtilOptind )
    {
        pNtkRes = Abc_NtkDarClockGate( pNtk, NULL, pPars );
    }
    else
    {
        Abc_Print( -1, "Wrong number of arguments.\n" );
        return 0;
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Clock gating has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: clockgate [-LNDCVK <num>] [-avwh] <file>\n" );
    Abc_Print( -2, "\t         sequential clock gating with observability don't-cares\n" );
    Abc_Print( -2, "\t-L num : max level number of a clock gate [default = %d]\n", pPars->nLevelMax );
    Abc_Print( -2, "\t-N num : max number of candidates for a flop [default = %d]\n", pPars->nCandMax );
    Abc_Print( -2, "\t-D num : max number of ODC levels to consider [default = %d]\n", pPars->nOdcMax );
    Abc_Print( -2, "\t-C num : max number of conflicts at a node [default = %d]\n", pPars->nConfMax );
    Abc_Print( -2, "\t-V num : min number of vars to recycle SAT solver [default = %d]\n", pPars->nVarsMin );
    Abc_Print( -2, "\t-K num : min number of flops to recycle SAT solver [default = %d]\n", pPars->nFlopsMin );
    Abc_Print( -2, "\t-a     : toggle minimizing area-only [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle even more detailed output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile   : (optional) constraints for primary inputs and register outputs\n");
    return 1;
}